

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_SetStackData_kOpPushData4_error_Test::~Script_SetStackData_kOpPushData4_error_Test
          (Script_SetStackData_kOpPushData4_error_Test *this)

{
  Script_SetStackData_kOpPushData4_error_Test *this_local;
  
  ~Script_SetStackData_kOpPushData4_error_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData4_error) {
  try {
    std::vector<uint8_t> bytes(2, 0xff);
    bytes[0] = 0x4e;
    Script script(bytes);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "OP_PUSHDATA4 is incorrect size.");
    return;
  }
  ASSERT_TRUE(false);
}